

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall embree::ISPCScene::~ISPCScene(ISPCScene *this)

{
  ulong uVar1;
  
  alignedUSMFree(this->geometries);
  alignedUSMFree(this->materials);
  if (this->numLights != 0) {
    uVar1 = 0;
    do {
      Light_destroy(this->lights[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->numLights);
  }
  alignedUSMFree(this->lights);
  return;
}

Assistant:

ISPCScene::~ISPCScene()
  {
    alignedUSMFree(geometries);
    alignedUSMFree(materials);

    for (size_t i=0; i<numLights; i++)
      Light_destroy(lights[i]);
    alignedUSMFree(lights);
  }